

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuiScope.cpp
# Opt level: O1

void __thiscall GuiScope::GuiScope(GuiScope *this)

{
  (this->super_IAutomation).super_IScope._vptr_IScope = (_func_int **)&PTR__GuiScope_001fc0c8;
  (this->vars_)._M_h._M_buckets = &(this->vars_)._M_h._M_single_bucket;
  (this->vars_)._M_h._M_bucket_count = 1;
  (this->vars_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->vars_)._M_h._M_element_count = 0;
  (this->vars_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->vars_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->vars_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

GuiScope::GuiScope() {}